

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_struct_definition
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  bool bVar1;
  members_type *this_00;
  ostream *poVar2;
  size_type sVar3;
  reference pptVar4;
  string local_d8;
  string local_b8;
  string local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_78;
  t_field **local_70;
  undefined1 local_58 [8];
  string tname;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&tname.field_2 + 8));
  type_name_abi_cxx11_((string *)local_58,this,&tstruct->super_t_type);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  poVar2 = std::operator<<(poVar2," =");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"object (self)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  sVar3 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar3 != 0) {
    local_70 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    tname.field_2._8_8_ = local_70;
    while( true ) {
      local_78._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&tname.field_2 + 8),&local_78);
      if (!bVar1) break;
      std::__cxx11::string::string((string *)&local_98,(string *)local_58);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tname.field_2 + 8));
      generate_ocaml_struct_member(this,out,&local_98,*pptVar4);
      std::__cxx11::string::~string((string *)&local_98);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&tname.field_2 + 8));
    }
  }
  generate_ocaml_method_copy(this,out,this_00);
  generate_ocaml_struct_writer(this,out,tstruct);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"end");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (is_exception) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"exception ");
    std::__cxx11::string::string((string *)&local_d8,(string *)local_58);
    t_generator::capitalize(&local_b8,(t_generator *)this,&local_d8);
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  generate_ocaml_struct_reader(this,out,tstruct);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " =" << endl;
  indent(out) << "object (self)" << endl;

  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      generate_ocaml_struct_member(out, tname, (*m_iter));
      out << endl;
    }
  }
  generate_ocaml_method_copy(out, members);
  generate_ocaml_struct_writer(out, tstruct);
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  generate_ocaml_struct_reader(out, tstruct);
}